

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Volume.cpp
# Opt level: O0

void idx2::Resize(volume *Vol,v3i *Dims3,allocator *Alloc)

{
  long local_a8;
  long local_a0;
  long local_98;
  long local_90;
  i64 NewSize;
  allocator *Alloc_local;
  v3i *Dims3_local;
  volume *Vol_local;
  dtype local_65;
  int local_64;
  long *local_60;
  v3i *local_58;
  long *local_50;
  allocator *local_48;
  long local_40;
  volume *local_38;
  volume *local_30;
  volume *local_28;
  
  local_60 = &local_a8;
  local_a8 = (long)(Dims3->field_0).field_0.X;
  local_a0 = (long)(Dims3->field_0).field_0.Y;
  local_98 = (long)(Dims3->field_0).field_0.Z;
  local_65 = Vol->Type;
  switch(local_65) {
  case int8:
  case uint8:
    local_64 = 1;
    break;
  case int16:
  case uint16:
    local_64 = 2;
    break;
  case int32:
  case uint32:
  case float32:
    local_64 = 4;
    break;
  case int64:
  case uint64:
  case float64:
    local_64 = 8;
    break;
  default:
    local_64 = 0;
  }
  local_90 = local_a8 * local_a0 * local_98 * (long)local_64;
  Alloc_local = (allocator *)Dims3;
  Dims3_local = (v3i *)Vol;
  if (((Vol->Buffer).Bytes < local_90) && ((Vol->Buffer).Bytes < local_90)) {
    NewSize = (i64)Alloc;
    Vol_local = Vol;
    local_58 = Dims3;
    local_50 = local_60;
    local_48 = Alloc;
    local_40 = local_90;
    local_38 = Vol;
    local_30 = Vol;
    local_28 = Vol;
    if (0 < (Vol->Buffer).Bytes) {
      DeallocBuf(&Vol->Buffer);
    }
    AllocBuf(&local_38->Buffer,local_40,local_48);
  }
  Dims3_local[2].field_0.field_3.XY.field_0 =
       (anon_union_8_4_6ba14846_for_v2<int>_1)
       ((long)(int)(*(uint *)&Alloc_local->_vptr_allocator & 0x1fffff) +
        (long)(int)(*(uint *)((long)&Alloc_local->_vptr_allocator + 4) & 0x1fffff) * 0x200000 +
       ((long)(int)(*(uint *)&Alloc_local[1]._vptr_allocator & 0x1fffff) << 0x2a));
  return;
}

Assistant:

void
Resize(volume* Vol, const v3i& Dims3, allocator* Alloc)
{
  idx2_Assert(Vol->Type != dtype::__Invalid__);
  i64 NewSize = Prod<u64>(Dims3) * SizeOf(Vol->Type);
  if (Size(Vol->Buffer) < NewSize)
    Resize(&Vol->Buffer, NewSize, Alloc);
  SetDims(Vol, Dims3);
}